

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ABGRToAR30Row_SSSE3(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  uvec8 auVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar2 = libyuv::kShuffleBR30;
  auVar8._8_4_ = 0x40400404;
  auVar8._0_8_ = 0x4040040440400404;
  auVar8._12_4_ = 0x40400404;
  auVar9._8_4_ = 0x3ff003ff;
  auVar9._0_8_ = 0x3ff003ff3ff003ff;
  auVar9._12_4_ = 0x3ff003ff;
  auVar10._8_4_ = 0xc000ff00;
  auVar10._0_8_ = 0xc000ff00c000ff00;
  auVar10._12_4_ = 0xc000ff00;
  auVar11._8_4_ = 0x400404;
  auVar11._0_8_ = 0x40040400400404;
  auVar11._12_4_ = 0x400404;
  lVar4 = (long)dst - (long)src;
  do {
    auVar6 = pshufb(*(undefined1 (*) [16])src,(undefined1  [16])auVar2);
    auVar7 = pmulhuw(auVar6,auVar8);
    auVar6 = pmulhuw(*(undefined1 (*) [16])src & auVar10,auVar11);
    auVar5._0_4_ = auVar6._0_4_ << 10;
    auVar5._4_4_ = auVar6._4_4_ << 10;
    auVar5._8_4_ = auVar6._8_4_ << 10;
    auVar5._12_4_ = auVar6._12_4_ << 10;
    *(undefined1 (*) [16])(lVar4 + (long)src) = auVar5 | auVar7 & auVar9;
    src = (uint8_t *)((long)src + 0x10);
    iVar3 = width + -4;
    bVar1 = 3 < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar1);
  return;
}

Assistant:

void ABGRToAR30Row_SSSE3(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "movdqa      %3,%%xmm2                     \n"  // shuffler for RB
      "movd        %4,%%xmm3                     \n"  // multipler for RB
      "movd        %5,%%xmm4                     \n"  // mask for R10 B10
      "movd        %6,%%xmm5                     \n"  // mask for AG
      "movd        %7,%%xmm6                     \n"  // multipler for AG
      "pshufd      $0x0,%%xmm3,%%xmm3            \n"
      "pshufd      $0x0,%%xmm4,%%xmm4            \n"
      "pshufd      $0x0,%%xmm5,%%xmm5            \n"
      "pshufd      $0x0,%%xmm6,%%xmm6            \n"
      "sub         %0,%1                         \n"

      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"  // fetch 4 ABGR pixels
      "movdqa      %%xmm0,%%xmm1                 \n"
      "pshufb      %%xmm2,%%xmm1                 \n"  // R0B0
      "pand        %%xmm5,%%xmm0                 \n"  // A0G0
      "pmulhuw     %%xmm3,%%xmm1                 \n"  // X2 R16 X4  B10
      "pmulhuw     %%xmm6,%%xmm0                 \n"  // X10 A2 X10 G10
      "pand        %%xmm4,%%xmm1                 \n"  // X2 R10 X10 B10
      "pslld       $10,%%xmm0                    \n"  // A2 x10 G10 x10
      "por         %%xmm1,%%xmm0                 \n"  // A2 R10 G10 B10
      "movdqu      %%xmm0,(%1,%0)                \n"  // store 4 AR30 pixels
      "add         $0x10,%0                      \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"

      : "+r"(src),          // %0
        "+r"(dst),          // %1
        "+r"(width)         // %2
      : "m"(kShuffleBR30),  // %3  reversed shuffler
        "m"(kMulRB10),      // %4
        "m"(kMaskRB10),     // %5
        "m"(kMaskAG10),     // %6
        "m"(kMulAG10)       // %7
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}